

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O1

__pid_t __thiscall acto::core::event::wait(event *this,void *__stat_loc)

{
  unique_lock<std::mutex> g;
  unique_lock<std::mutex> local_28;
  
  local_28._M_owns = false;
  local_28._M_device = &this->mutex_;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if (this->triggered_ == false) {
    do {
      std::condition_variable::wait((unique_lock *)&this->cond_);
    } while (this->triggered_ != true);
  }
  this->triggered_ = (bool)(this->auto_ ^ 1);
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return 1;
}

Assistant:

wait_result event::wait() {
  std::unique_lock g(mutex_);

  cond_.wait(g, [this] { return triggered_; });

  triggered_ = !auto_;

  return wait_result::signaled;
}